

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::parse_neighbor_features(string *nf_string,search *sch)

{
  int iVar1;
  uint uVar2;
  char *__dest;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  v_array<int> *this;
  substring s;
  int32_t enc;
  vector<substring,_std::allocator<substring>_> cmd;
  
  this = &sch->priv->neighbor_features;
  v_array<int>::clear(this);
  if (nf_string->_M_string_length != 0) {
    __dest = (char *)operator_new__(nf_string->_M_string_length + 1);
    strcpy(__dest,(nf_string->_M_dataplus)._M_p);
    __s = strtok(__dest,",");
    cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    while (__s != (char *)0x0) {
      if (cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
          super__Vector_impl_data._M_start) {
        cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
        super__Vector_impl_data._M_finish =
             cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      sVar3 = strlen(__s);
      s.end = __s + sVar3;
      s.begin = __s;
      tokenize<std::vector<substring,std::allocator<substring>>>(':',s,&cmd,true);
      lVar5 = (long)cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      if (lVar5 == 2) {
        iVar1 = int_of_substring(*cmd.super__Vector_base<substring,_std::allocator<substring>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
            super__Vector_impl_data._M_start[1].end <=
            cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
            super__Vector_impl_data._M_start[1].begin) goto LAB_0021f421;
        uVar2 = (uint)(byte)*cmd.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                             super__Vector_impl_data._M_start[1].begin;
      }
      else if (lVar5 == 1) {
        iVar1 = int_of_substring(*cmd.super__Vector_base<substring,_std::allocator<substring>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
LAB_0021f421:
        uVar2 = 0x20;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "warning: ignoring malformed neighbor specification: \'");
        poVar4 = std::operator<<(poVar4,__s);
        poVar4 = std::operator<<(poVar4,"\'");
        iVar1 = 0;
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar2 = 0x20;
      }
      enc = iVar1 << 0x18 | uVar2;
      v_array<int>::push_back(this,&enc);
      __s = strtok((char *)0x0,",");
    }
    operator_delete__(__dest);
    std::_Vector_base<substring,_std::allocator<substring>_>::~_Vector_base
              (&cmd.super__Vector_base<substring,_std::allocator<substring>_>);
  }
  return;
}

Assistant:

void parse_neighbor_features(string& nf_string, search& sch)
{
  search_private& priv = *sch.priv;
  priv.neighbor_features.clear();
  size_t len = nf_string.length();
  if (len == 0)
    return;

  char* cstr = new char[len + 1];
  strcpy(cstr, nf_string.c_str());

  char* p = strtok(cstr, ",");
  std::vector<substring> cmd;
  while (p != 0)
  {
    cmd.clear();
    substring me = {p, p + strlen(p)};
    tokenize(':', me, cmd, true);

    int32_t posn = 0;
    char ns = ' ';
    if (cmd.size() == 1)
    {
      posn = int_of_substring(cmd[0]);
      ns = ' ';
    }
    else if (cmd.size() == 2)
    {
      posn = int_of_substring(cmd[0]);
      ns = (cmd[1].end > cmd[1].begin) ? cmd[1].begin[0] : ' ';
    }
    else
    {
      std::cerr << "warning: ignoring malformed neighbor specification: '" << p << "'" << endl;
    }
    int32_t enc = (posn << 24) | (ns & 0xFF);
    priv.neighbor_features.push_back(enc);

    p = strtok(nullptr, ",");
  }

  delete[] cstr;
}